

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O3

size_t HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  BYTE *op;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (cSrcSize == 0) {
    return 0xfffffffffffffffd;
  }
  if (cSrcSize < 8) {
    uVar6 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar6 = uVar6 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xfffffffffffffffc;
    }
    uVar7 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar4 = 0;
  }
  else {
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xfffffffffffffff7 < cSrcSize) {
      return cSrcSize;
    }
    uVar6 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar4 = cSrcSize - 8;
    uVar7 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = ~uVar7 + 9;
  }
  uVar10 = (ulong)uVar7;
  puVar1 = (undefined1 *)((long)dst + dstSize);
  pvVar5 = (void *)((long)cSrc + lVar4);
  uVar7 = -(uint)*(ushort *)((long)DTable + 2) & 0x3f;
  do {
    if (lVar4 < 8) {
      if (lVar4 == 0) {
LAB_00186b1b:
        if (dst < puVar1) {
          do {
            uVar9 = (uVar6 << (uVar10 & 0x3f)) >> uVar7;
            uVar3 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + (int)uVar10;
            *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
            dst = (void *)((long)dst + 1);
            uVar10 = (ulong)uVar3;
          } while (dst < puVar1);
        }
        else {
          uVar3 = (uint)uVar10;
        }
        if (uVar3 != 0x40) {
          dstSize = 0xfffffffffffffffc;
        }
        if (pvVar5 != cSrc) {
          dstSize = 0xfffffffffffffffc;
        }
        return dstSize;
      }
      uVar3 = (uint)(uVar10 >> 3);
      bVar11 = cSrc <= (void *)((long)pvVar5 - (uVar10 >> 3));
      if (!bVar11) {
        uVar3 = (uint)lVar4;
      }
      uVar8 = (uint)uVar10 + uVar3 * -8;
    }
    else {
      uVar3 = (uint)(uVar10 >> 3);
      uVar8 = (uint)uVar10 & 7;
      bVar11 = true;
    }
    uVar10 = (ulong)uVar8;
    lVar4 = lVar4 - (ulong)uVar3;
    pvVar5 = (void *)((long)cSrc + lVar4);
    uVar6 = *(ulong *)((long)cSrc + lVar4);
    if ((puVar1 + -3 <= dst) || (!bVar11)) goto LAB_00186b1b;
    uVar10 = (uVar6 << (uVar10 & 0x3f)) >> uVar7;
    uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar8;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar6 << ((ulong)uVar8 & 0x3f)) >> uVar7;
    uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar8;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar6 << ((ulong)uVar8 & 0x3f)) >> uVar7;
    uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar8;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar9 = (uVar6 << ((ulong)uVar8 & 0x3f)) >> uVar7;
    uVar8 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar8;
    uVar10 = (ulong)uVar8;
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    dst = (void *)((long)dst + 4);
    if (0x40 < uVar8) goto LAB_00186b1b;
  } while( true );
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                /* fall-through */

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                /* fall-through */

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                /* fall-through */

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                /* fall-through */

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                /* fall-through */

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                /* fall-through */

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}